

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psmodule.c
# Opt level: O3

FT_UInt32 ps_unicode_value(char *glyph_name)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  FT_UInt32 FVar5;
  FT_UInt32 FVar6;
  byte bVar7;
  byte *pbVar8;
  byte *pbVar9;
  ushort *puVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  ushort uVar14;
  uchar *puVar15;
  byte bVar16;
  uint uVar17;
  long lVar18;
  byte bVar19;
  int iVar20;
  
  bVar1 = *glyph_name;
  if (bVar1 == 0x75) {
    if ((glyph_name[1] == 'n') && (glyph_name[2] == 'i')) {
      pbVar8 = (byte *)(glyph_name + 3);
      uVar4 = 0;
      uVar13 = 5;
      do {
        bVar7 = *pbVar8;
        uVar17 = bVar7 - 0x37;
        if (bVar7 - 0x47 < 0xfffffffa) {
          uVar17 = 0x10;
        }
        if (bVar7 - 0x30 < 10) {
          uVar17 = bVar7 - 0x30;
        }
        if (0xf < uVar17) goto LAB_00239d7f;
        uVar4 = uVar4 << 4 | uVar17;
        pbVar8 = pbVar8 + 1;
        uVar13 = uVar13 - 1;
      } while (1 < uVar13);
      if (glyph_name[7] == '\0') {
        return uVar4;
      }
      if (glyph_name[7] == '.') goto LAB_00239df1;
    }
LAB_00239d7f:
    pbVar8 = (byte *)(glyph_name + 1);
    pbVar9 = (byte *)(glyph_name + 7);
    uVar4 = 0;
    uVar13 = 6;
    do {
      bVar7 = *pbVar8;
      uVar17 = bVar7 - 0x37;
      if (bVar7 - 0x47 < 0xfffffffa) {
        uVar17 = 0x10;
      }
      if (bVar7 - 0x30 < 10) {
        uVar17 = bVar7 - 0x30;
      }
      if (0xf < uVar17) {
        pbVar9 = pbVar8;
        if (2 < uVar13) goto LAB_00239dfb;
        break;
      }
      uVar4 = uVar17 | uVar4 << 4;
      pbVar8 = pbVar8 + 1;
      bVar2 = 1 < uVar13;
      uVar13 = uVar13 - 1;
    } while (bVar2);
    if (*pbVar9 == 0) {
      return uVar4;
    }
    if (*pbVar9 == 0x2e) {
LAB_00239df1:
      return uVar4 | 0x80000000;
    }
  }
LAB_00239dfb:
  lVar18 = 0;
  bVar7 = bVar1;
  while ((bVar7 != 0 && (bVar7 != 0x2e))) {
    lVar3 = lVar18 + 1;
    lVar18 = lVar18 + 1;
    bVar7 = glyph_name[lVar3];
  }
  if (lVar18 == 0) {
    return 0;
  }
  pbVar8 = (byte *)(glyph_name + 1);
  iVar12 = 0;
  iVar20 = 0x34;
  do {
    uVar14 = *(ushort *)("" + ((long)(iVar20 + iVar12) & 0xfffffffffffffffeU) + 2) << 8 |
             *(ushort *)("" + ((long)(iVar20 + iVar12) & 0xfffffffffffffffeU) + 2) >> 8;
    bVar16 = ""[uVar14];
    if ((bVar16 & 0x7f) == bVar1) {
      puVar15 = "" + uVar14;
      bVar1 = bVar16;
      if (lVar18 != 1) goto LAB_00239eb1;
      goto LAB_00239e95;
    }
    iVar11 = iVar20 + iVar12 >> 1;
    if ((char)(bVar16 & 0x7f) < (char)bVar1) {
      iVar12 = iVar11 + 1;
      iVar11 = iVar20;
    }
    iVar20 = iVar11;
  } while (iVar12 < iVar20);
LAB_00239e72:
  FVar6 = 0;
  goto LAB_00239e74;
LAB_00239eb1:
  do {
    bVar16 = puVar15[1];
    bVar19 = (byte)(bVar16 & 0x7f);
    if ((char)bVar1 < '\0') {
      if (*pbVar8 != bVar19) goto LAB_00239e72;
      puVar15 = puVar15 + 1;
    }
    else {
      FVar6 = 0;
      if (bVar19 == 0) goto LAB_00239e74;
      puVar10 = (ushort *)(puVar15 + (ulong)(bVar16 >> 7) * 2);
      iVar12 = (bVar16 & 0x7f) + 1;
      while( true ) {
        puVar10 = puVar10 + 1;
        uVar14 = *puVar10 << 8 | *puVar10 >> 8;
        bVar16 = ""[uVar14];
        if (*pbVar8 == (bVar16 & 0x7f)) break;
        iVar12 = iVar12 + -1;
        if (iVar12 < 2) goto LAB_00239e74;
      }
      puVar15 = "" + uVar14;
    }
    pbVar8 = pbVar8 + 1;
    bVar1 = bVar16;
  } while ((byte *)(glyph_name + lVar18) != pbVar8);
LAB_00239e95:
  FVar6 = 0;
  if ((-1 < (char)bVar16) && ((char)puVar15[1] < '\0')) {
    FVar6 = (FT_UInt32)(ushort)(*(ushort *)(puVar15 + 2) << 8 | *(ushort *)(puVar15 + 2) >> 8);
  }
LAB_00239e74:
  FVar5 = FVar6 + 0x80000000;
  if (bVar7 != 0x2e) {
    FVar5 = FVar6;
  }
  return FVar5;
}

Assistant:

static FT_UInt32
  ps_unicode_value( const char*  glyph_name )
  {
    /* If the name begins with `uni', then the glyph name may be a */
    /* hard-coded unicode character code.                          */
    if ( glyph_name[0] == 'u' &&
         glyph_name[1] == 'n' &&
         glyph_name[2] == 'i' )
    {
      /* determine whether the next four characters following are */
      /* hexadecimal.                                             */

      /* XXX: Add code to deal with ligatures, i.e. glyph names like */
      /*      `uniXXXXYYYYZZZZ'...                                   */

      FT_Int       count;
      FT_UInt32    value = 0;
      const char*  p     = glyph_name + 3;


      for ( count = 4; count > 0; count--, p++ )
      {
        char          c = *p;
        unsigned int  d;


        d = (unsigned char)c - '0';
        if ( d >= 10 )
        {
          d = (unsigned char)c - 'A';
          if ( d >= 6 )
            d = 16;
          else
            d += 10;
        }

        /* Exit if a non-uppercase hexadecimal character was found   */
        /* -- this also catches character codes below `0' since such */
        /* negative numbers cast to `unsigned int' are far too big.  */
        if ( d >= 16 )
          break;

        value = ( value << 4 ) + d;
      }

      /* there must be exactly four hex digits */
      if ( count == 0 )
      {
        if ( *p == '\0' )
          return value;
        if ( *p == '.' )
          return (FT_UInt32)( value | VARIANT_BIT );
      }
    }

    /* If the name begins with `u', followed by four to six uppercase */
    /* hexadecimal digits, it is a hard-coded unicode character code. */
    if ( glyph_name[0] == 'u' )
    {
      FT_Int       count;
      FT_UInt32    value = 0;
      const char*  p     = glyph_name + 1;


      for ( count = 6; count > 0; count--, p++ )
      {
        char          c = *p;
        unsigned int  d;


        d = (unsigned char)c - '0';
        if ( d >= 10 )
        {
          d = (unsigned char)c - 'A';
          if ( d >= 6 )
            d = 16;
          else
            d += 10;
        }

        if ( d >= 16 )
          break;

        value = ( value << 4 ) + d;
      }

      if ( count <= 2 )
      {
        if ( *p == '\0' )
          return value;
        if ( *p == '.' )
          return (FT_UInt32)( value | VARIANT_BIT );
      }
    }

    /* Look for a non-initial dot in the glyph name in order to */
    /* find variants like `A.swash', `e.final', etc.            */
    {
      FT_UInt32    value = 0;
      const char*  p     = glyph_name;


      for ( ; *p && *p != '.'; p++ )
        ;

      /* now look up the glyph in the Adobe Glyph List;      */
      /* `.notdef', `.null' and the empty name are short cut */
      if ( p > glyph_name )
      {
        value = (FT_UInt32)ft_get_adobe_glyph_index( glyph_name, p );

        if ( *p == '.' )
          value |= (FT_UInt32)VARIANT_BIT;
      }

      return value;
    }
  }